

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O1

void __thiscall icu_63::RegexStaticSets::RegexStaticSets(RegexStaticSets *this,UErrorCode *status)

{
  undefined1 *this_00;
  Regex8BitSet *pRVar1;
  UBool UVar2;
  UnicodeSet *pUVar3;
  UnicodeSet *pUVar4;
  UText *pUVar5;
  UnicodeSet *pUVar6;
  long lVar7;
  int32_t i;
  uint uVar8;
  ulong uVar9;
  ConstChar16Ptr local_420;
  ConstChar16Ptr local_418;
  ConstChar16Ptr local_410;
  ConstChar16Ptr local_408;
  ConstChar16Ptr local_400;
  ConstChar16Ptr local_3f8;
  ConstChar16Ptr local_3f0;
  ConstChar16Ptr local_3e8;
  ConstChar16Ptr local_3e0;
  ConstChar16Ptr local_3d8;
  ConstChar16Ptr local_3d0;
  UnicodeSet **local_3c8;
  Regex8BitSet *local_3c0;
  char16_t *local_3b8;
  char16_t *local_3a8;
  char16_t *local_398;
  char16_t *local_388;
  char16_t *local_378;
  char16_t *local_368;
  char16_t *local_358;
  char16_t *local_348;
  char16_t *local_338;
  char16_t *local_328;
  char16_t *local_318;
  UnicodeSet local_308;
  UnicodeString local_2b0;
  undefined1 local_270 [64];
  undefined1 local_230 [64];
  undefined1 local_1f0 [64];
  undefined1 local_1b0 [64];
  undefined1 local_170 [64];
  undefined1 local_130 [64];
  undefined1 local_f0 [64];
  undefined1 local_b0 [128];
  
  local_3c0 = this->fPropSets8;
  lVar7 = 0;
  memset(local_3c0,0,0x1a0);
  this_00 = &this->field_0x208;
  pUVar6 = (UnicodeSet *)this_00;
  do {
    UnicodeSet::UnicodeSet(pUVar6);
    lVar7 = lVar7 + -0x58;
    pUVar6 = pUVar6 + 1;
  } while (lVar7 != -0x370);
  local_3d0.p_ = (char16_t *)gUnescapeCharPattern;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_308,'\x01',&local_3d0,-1);
  pUVar6 = &local_308;
  UnicodeSet::UnicodeSet(&this->fUnescapeCharSet,(UnicodeString *)pUVar6,status);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_308);
  local_318 = local_3d0.p_;
  this->fPropSets[10] = (UnicodeSet *)0x0;
  this->fPropSets[0xb] = (UnicodeSet *)0x0;
  this->fPropSets[8] = (UnicodeSet *)0x0;
  this->fPropSets[9] = (UnicodeSet *)0x0;
  this->fPropSets[6] = (UnicodeSet *)0x0;
  this->fPropSets[7] = (UnicodeSet *)0x0;
  this->fPropSets[4] = (UnicodeSet *)0x0;
  this->fPropSets[5] = (UnicodeSet *)0x0;
  this->fPropSets[2] = (UnicodeSet *)0x0;
  this->fPropSets[3] = (UnicodeSet *)0x0;
  this->fPropSets[0] = (UnicodeSet *)0x0;
  this->fPropSets[1] = (UnicodeSet *)0x0;
  this->fPropSets[0xc] = (UnicodeSet *)0x0;
  this->fRuleDigitsAlias = (UnicodeSet *)0x0;
  this->fEmptyText = (UText *)0x0;
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_3d8.p_ = (char16_t *)gIsWordPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)(local_b0 + 0x40),'\x01',&local_3d8,-1);
    pUVar6 = (UnicodeSet *)(local_b0 + 0x40);
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[1] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)(local_b0 + 0x40));
    local_328 = local_3d8.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_3e0.p_ = (char16_t *)gIsSpacePattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_b0,'\x01',&local_3e0,-1);
    pUVar6 = (UnicodeSet *)local_b0;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[4] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
    local_338 = local_3e0.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_3e8.p_ = (char16_t *)gGC_ExtendPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_f0,'\x01',&local_3e8,-1);
    pUVar6 = (UnicodeSet *)local_f0;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[6] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_f0);
    local_348 = local_3e8.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_3f0.p_ = (char16_t *)gGC_ControlPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_130,'\x01',&local_3f0,-1);
    pUVar6 = (UnicodeSet *)local_130;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[7] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_130);
    local_358 = local_3f0.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_3f8.p_ = (char16_t *)gGC_LPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_170,'\x01',&local_3f8,-1);
    pUVar6 = (UnicodeSet *)local_170;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[8] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_170);
    local_368 = local_3f8.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_400.p_ = (char16_t *)gGC_VPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_1b0,'\x01',&local_400,-1);
    pUVar6 = (UnicodeSet *)local_1b0;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[0xb] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_1b0);
    local_378 = local_400.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_408.p_ = (char16_t *)gGC_TPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_1f0,'\x01',&local_408,-1);
    pUVar6 = (UnicodeSet *)local_1f0;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[0xc] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_1f0);
    local_388 = local_408.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_410.p_ = (char16_t *)gGC_LVPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_230,'\x01',&local_410,-1);
    pUVar6 = (UnicodeSet *)local_230;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[9] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_230);
    local_398 = local_410.p_;
  }
  pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
  if (pUVar3 == (UnicodeSet *)0x0) {
    pUVar4 = (UnicodeSet *)0x0;
  }
  else {
    local_418.p_ = (char16_t *)gGC_LVTPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_270,'\x01',&local_418,-1);
    pUVar6 = (UnicodeSet *)local_270;
    UnicodeSet::UnicodeSet(pUVar3,(UnicodeString *)pUVar6,status);
    pUVar4 = pUVar3;
  }
  this->fPropSets[10] = pUVar4;
  if (pUVar3 != (UnicodeSet *)0x0) {
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_270);
    local_3a8 = local_418.p_;
  }
  if ((((((this->fPropSets[1] != (UnicodeSet *)0x0) && (this->fPropSets[4] != (UnicodeSet *)0x0)) &&
        (this->fPropSets[6] != (UnicodeSet *)0x0)) &&
       ((this->fPropSets[7] != (UnicodeSet *)0x0 && (this->fPropSets[8] != (UnicodeSet *)0x0)))) &&
      ((this->fPropSets[0xb] != (UnicodeSet *)0x0 &&
       ((this->fPropSets[0xc] != (UnicodeSet *)0x0 && (this->fPropSets[9] != (UnicodeSet *)0x0))))))
     && (this->fPropSets[10] != (UnicodeSet *)0x0)) {
    if (U_ZERO_ERROR < *status) {
      return;
    }
    pUVar3 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar6);
    if (pUVar3 == (UnicodeSet *)0x0) {
      pUVar3 = (UnicodeSet *)0x0;
    }
    else {
      pUVar6 = (UnicodeSet *)0x0;
      UnicodeSet::UnicodeSet(pUVar3,0,0x10ffff);
    }
    this->fPropSets[5] = pUVar3;
    if (pUVar3 != (UnicodeSet *)0x0) {
      UnicodeSet::remove(pUVar3,(char *)0xac00);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[7]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[8]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xb]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xc]);
      local_3c8 = &this->fRuleDigitsAlias;
      lVar7 = 0;
      do {
        if (this->fPropSets[lVar7] != (UnicodeSet *)0x0) {
          UnicodeSet::compact(this->fPropSets[lVar7]);
          pRVar1 = local_3c0;
          pUVar6 = this->fPropSets[lVar7];
          if (pUVar6 != (UnicodeSet *)0x0) {
            uVar9 = 0;
            do {
              UVar2 = UnicodeSet::contains(pUVar6,(int)uVar9);
              if (UVar2 != '\0') {
                pRVar1[lVar7].d[uVar9 >> 3] =
                     pRVar1[lVar7].d[uVar9 >> 3] | (byte)(1 << ((byte)uVar9 & 7));
              }
              uVar8 = (int)uVar9 + 1;
              uVar9 = (ulong)uVar8;
            } while (uVar8 != 0x100);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xd);
      local_420.p_ = (char16_t *)gRuleSet_rule_char_pattern;
      icu_63::UnicodeString::UnicodeString(&local_2b0,'\x01',&local_420,-1);
      UnicodeSet::UnicodeSet(&local_308,&local_2b0,status);
      UnicodeSet::operator=((UnicodeSet *)&this->field_0x2b8,&local_308);
      UnicodeSet::~UnicodeSet(&local_308);
      icu_63::UnicodeString::~UnicodeString(&local_2b0);
      local_3b8 = local_420.p_;
      UnicodeSet::add((UnicodeSet *)&this->field_0x260,0x30,0x39);
      UnicodeSet::add((UnicodeSet *)this_00,0x41,0x5a);
      UnicodeSet::add((UnicodeSet *)this_00,0x61,0x7a);
      *local_3c8 = (UnicodeSet *)&this->field_0x260;
      lVar7 = 0;
      do {
        UnicodeSet::compact((UnicodeSet *)(this_00 + lVar7));
        lVar7 = lVar7 + 0x58;
      } while (lVar7 != 0x370);
      pUVar6 = (UnicodeSet *)0x0;
      pUVar5 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
      this->fEmptyText = pUVar5;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return;
      }
    }
  }
  lVar7 = 0;
  do {
    pUVar3 = this->fPropSets[lVar7];
    if (pUVar3 != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(pUVar3);
      UMemory::operator_delete((UMemory *)pUVar3,pUVar6);
    }
    this->fPropSets[lVar7] = (UnicodeSet *)0x0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xd);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RegexStaticSets::RegexStaticSets(UErrorCode *status)
:
fUnescapeCharSet(UnicodeString(TRUE, gUnescapeCharPattern, -1), *status),
fRuleDigitsAlias(NULL),
fEmptyText(NULL)
{
    // First zero out everything
    int i;
    for (i=0; i<URX_LAST_SET; i++) {
        fPropSets[i] = NULL;
    }
    // Then init the sets to their correct values.
    fPropSets[URX_ISWORD_SET]  = new UnicodeSet(UnicodeString(TRUE, gIsWordPattern, -1),     *status);
    fPropSets[URX_ISSPACE_SET] = new UnicodeSet(UnicodeString(TRUE, gIsSpacePattern, -1),    *status);
    fPropSets[URX_GC_EXTEND]   = new UnicodeSet(UnicodeString(TRUE, gGC_ExtendPattern, -1),  *status);
    fPropSets[URX_GC_CONTROL]  = new UnicodeSet(UnicodeString(TRUE, gGC_ControlPattern, -1), *status);
    fPropSets[URX_GC_L]        = new UnicodeSet(UnicodeString(TRUE, gGC_LPattern, -1),       *status);
    fPropSets[URX_GC_V]        = new UnicodeSet(UnicodeString(TRUE, gGC_VPattern, -1),       *status);
    fPropSets[URX_GC_T]        = new UnicodeSet(UnicodeString(TRUE, gGC_TPattern, -1),       *status);
    fPropSets[URX_GC_LV]       = new UnicodeSet(UnicodeString(TRUE, gGC_LVPattern, -1),      *status);
    fPropSets[URX_GC_LVT]      = new UnicodeSet(UnicodeString(TRUE, gGC_LVTPattern, -1),     *status);
    
    // Check for null pointers
    if (fPropSets[URX_ISWORD_SET] == NULL || fPropSets[URX_ISSPACE_SET] == NULL || fPropSets[URX_GC_EXTEND] == NULL || 
        fPropSets[URX_GC_CONTROL] == NULL || fPropSets[URX_GC_L] == NULL || fPropSets[URX_GC_V] == NULL || 
        fPropSets[URX_GC_T] == NULL || fPropSets[URX_GC_LV] == NULL || fPropSets[URX_GC_LVT] == NULL) {
        goto ExitConstrDeleteAll;
    }
    if (U_FAILURE(*status)) {
        // Bail out if we were unable to create the above sets.
        // The rest of the initialization needs them, so we cannot proceed.
        return;
    }


    //
    // The following sets  are dynamically constructed, because their
    //   initialization strings would be unreasonable.
    //


    //
    //  "Normal" is the set of characters that don't need special handling
    //            when finding grapheme cluster boundaries.
    //
    fPropSets[URX_GC_NORMAL] = new UnicodeSet(0, UnicodeSet::MAX_VALUE);
    // Null pointer check
    if (fPropSets[URX_GC_NORMAL] == NULL) {
    	goto ExitConstrDeleteAll;
    }
    fPropSets[URX_GC_NORMAL]->remove(0xac00, 0xd7a4);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_CONTROL]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_L]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_V]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_T]);

    // Initialize the 8-bit fast bit sets from the parallel full
    //   UnicodeSets.
    for (i=0; i<URX_LAST_SET; i++) {
        if (fPropSets[i]) {
            fPropSets[i]->compact();
            fPropSets8[i].init(fPropSets[i]);
        }
    }

    // Sets used while parsing rules, but not referenced from the parse state table
    fRuleSets[kRuleSet_rule_char-128]   = UnicodeSet(UnicodeString(TRUE, gRuleSet_rule_char_pattern, -1),   *status);
    fRuleSets[kRuleSet_digit_char-128].add((UChar)0x30, (UChar)0x39);    // [0-9]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x41, (UChar)0x5A);  // [A-Z]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x61, (UChar)0x7A);  // [a-z]
    fRuleDigitsAlias = &fRuleSets[kRuleSet_digit_char-128];
    for (i=0; i<UPRV_LENGTHOF(fRuleSets); i++) {
        fRuleSets[i].compact();
    }
    
    // Finally, initialize an empty string for utility purposes
    fEmptyText = utext_openUChars(NULL, NULL, 0, status);
    
    if (U_SUCCESS(*status)) {
        return;
    }

ExitConstrDeleteAll: // Remove fPropSets and fRuleSets and return error
    for (i=0; i<URX_LAST_SET; i++) {
        delete fPropSets[i];
        fPropSets[i] = NULL;
    }
    if (U_SUCCESS(*status)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
    }
}